

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O1

void Contract_dyn(box *P,deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                         *d_all_mes_vector,deque<double,_std::allocator<double>_> *alpha_mes_vector,
                 deque<double,_std::allocator<double>_> *t_history_vector,
                 deque<interval,_std::allocator<interval>_> *xhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *yhat_history_vector,
                 deque<interval,_std::allocator<interval>_> *psihat_history_vector,
                 deque<interval,_std::allocator<interval>_> *vrxhat_history_vector,double *d_max_err
                 ,double *alpha_max_err,int *sdir,interval *alphashat,
                 vector<double,_std::allocator<double>_> *walls_xa,
                 vector<double,_std::allocator<double>_> *walls_ya,
                 vector<double,_std::allocator<double>_> *walls_xb,
                 vector<double,_std::allocator<double>_> *walls_yb,
                 vector<double,_std::allocator<double>_> *circles_x,
                 vector<double,_std::allocator<double>_> *circles_y,
                 vector<double,_std::allocator<double>_> *circles_r)

{
  iterator *this;
  double dVar1;
  double dVar2;
  _Map_pointer ppdVar3;
  _Elt_pointer pdVar4;
  pointer piVar5;
  bool bVar6;
  ulong uVar7;
  double *pdVar8;
  reference pvVar9;
  reference piVar10;
  interval *piVar11;
  long lVar12;
  reference piVar13;
  double *pdVar14;
  long lVar15;
  long __n;
  ulong uVar16;
  iterator *this_00;
  int local_3bc;
  _Deque_iterator<interval,_interval_&,_interval_*> *local_3b8;
  _Deque_iterator<interval,_interval_&,_interval_*> *local_3b0;
  _Deque_iterator<interval,_interval_&,_interval_*> *local_3a8;
  interval xk;
  box Pxyj;
  vector<int,_std::allocator<int>_> Pigroup;
  long local_358;
  box Pt;
  vector<box,_std::allocator<box>_> Pi;
  interval xt;
  interval yt;
  interval yk;
  vector<box,_std::allocator<box>_> Pj;
  interval local_2a0;
  vector<double,_std::allocator<double>_> local_288;
  vector<double,_std::allocator<double>_> local_270;
  vector<double,_std::allocator<double>_> local_258;
  vector<double,_std::allocator<double>_> local_240;
  vector<double,_std::allocator<double>_> local_228;
  vector<double,_std::allocator<double>_> local_210;
  vector<double,_std::allocator<double>_> local_1f8;
  interval dhat;
  interval local_1c8;
  interval local_1b0;
  interval local_198;
  interval local_180;
  interval alphahat;
  interval local_150;
  interval local_138;
  interval local_120;
  interval local_108;
  interval local_f0;
  interval local_d8;
  interval local_c0;
  interval local_a8;
  interval local_90;
  interval local_78;
  interval local_60;
  interval local_48;
  
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  this_00 = &(d_all_mes_vector->
             super__Deque_base<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
             )._M_impl.super__Deque_impl_data._M_start;
  local_3a8 = &(xhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl
               .super__Deque_impl_data._M_start;
  local_3b0 = &(yhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl
               .super__Deque_impl_data._M_start;
  local_3b8 = &(psihat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>).
               _M_impl.super__Deque_impl_data._M_start;
  this = &(vrxhat_history_vector->super__Deque_base<interval,_std::allocator<interval>_>)._M_impl.
          super__Deque_impl_data._M_start;
  local_3bc = 0;
  do {
    ppdVar3 = (alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
              super__Deque_impl_data._M_finish._M_node;
    if ((int)((int)((ulong)((long)(alpha_mes_vector->
                                  super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Deque_impl_data._M_start._M_last -
                           (long)(alpha_mes_vector->
                                 super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Deque_impl_data._M_start._M_cur) >> 3) +
              (int)((ulong)((long)(alpha_mes_vector->
                                  super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                                  super__Deque_impl_data._M_finish._M_cur -
                           (long)(alpha_mes_vector->
                                 super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Deque_impl_data._M_finish._M_first) >> 3) +
             ((((uint)((int)ppdVar3 -
                      *(int *)&(alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>
                               )._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (uint)(ppdVar3 == (_Map_pointer)0x0)) * 0x40) <= local_3bc) {
      if (Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish
          != Pi.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
             _M_start) {
        C_acc_opt(P,&Pi);
        C_acc_opt(P,&Pi);
      }
      if (Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::vector<box,_std::allocator<box>_>::~vector(&Pi);
      return;
    }
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    Pj.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    pdVar4 = (alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    lVar15 = (long)local_3bc;
    uVar7 = ((long)pdVar4 -
             (long)(alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 3) + lVar15;
    if (uVar7 < 0x40) {
      pdVar8 = pdVar4 + lVar15;
    }
    else {
      uVar16 = uVar7 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar7) {
        uVar16 = uVar7 >> 6;
      }
      pdVar8 = (alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar16] + uVar7 + uVar16 * -0x40;
    }
    dhat.inf = *pdVar8 - *alpha_max_err;
    if (uVar7 < 0x40) {
      pdVar8 = pdVar4 + lVar15;
    }
    else {
      uVar16 = uVar7 >> 6 | 0xfc00000000000000;
      if (0 < (long)uVar7) {
        uVar16 = uVar7 >> 6;
      }
      pdVar8 = (alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
               super__Deque_impl_data._M_start._M_node[uVar16] + uVar7 + uVar16 * -0x40;
    }
    xt.inf = *alpha_max_err + *pdVar8;
    interval::interval(&alphahat,&dhat.inf,&xt.inf);
    pvVar9 = std::
             _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
             ::operator[](this_00,(long)local_3bc);
    if (0 < (int)((ulong)((long)(pvVar9->super__Vector_base<interval,_std::allocator<interval>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pvVar9->super__Vector_base<interval,_std::allocator<interval>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
      local_358 = 0;
      do {
        pvVar9 = std::
                 _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
                 ::operator[](this_00,(long)local_3bc);
        piVar5 = (pvVar9->super__Vector_base<interval,_std::allocator<interval>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        xk.inf = *d_max_err;
        yt.inf = -xk.inf;
        interval::interval(&xt,&yt.inf,&xk.inf);
        operator+(piVar5 + local_358,&xt);
        piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                            (local_3a8,(long)local_3bc);
        interval::interval(&local_90,piVar10);
        piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                            (local_3b0,(long)local_3bc);
        interval::interval(&local_a8,piVar10);
        box::box(&Pxyj,(vector<interval,_std::allocator<interval>_> *)&local_90,
                 (vector<interval,_std::allocator<interval>_> *)&local_a8);
        xt.inf = -INFINITY;
        yt.inf = INFINITY;
        interval::interval(&local_c0,&xt.inf,&yt.inf);
        xk.inf = -INFINITY;
        yk.inf = INFINITY;
        interval::interval(&local_48,&xk.inf,&yk.inf);
        box::box(&Pt,(vector<interval,_std::allocator<interval>_> *)&local_c0,
                 (vector<interval,_std::allocator<interval>_> *)&local_48);
        interval::interval(&local_d8,&dhat);
        operator*(&yt,(double)*sdir,&alphahat);
        operator+(&yt,alphashat);
        piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                            (local_3b8,(long)local_3bc);
        operator+(&xt,piVar10);
        BoxTranslate(&Pxyj,&Pt,&local_d8,&local_f0,1);
        piVar11 = box::operator[](&Pt,1);
        interval::interval(&xt,piVar11);
        piVar11 = box::operator[](&Pt,2);
        interval::interval(&yt,piVar11);
        std::vector<double,_std::allocator<double>_>::vector(&local_210,walls_xa);
        std::vector<double,_std::allocator<double>_>::vector(&local_228,walls_ya);
        std::vector<double,_std::allocator<double>_>::vector(&local_240,walls_xb);
        std::vector<double,_std::allocator<double>_>::vector(&local_258,walls_yb);
        std::vector<double,_std::allocator<double>_>::vector(&local_270,circles_x);
        std::vector<double,_std::allocator<double>_>::vector(&local_288,circles_y);
        std::vector<double,_std::allocator<double>_>::vector(&local_1f8,circles_r);
        CPointInSegmentsOrCircles
                  (&xt,&yt,&local_210,&local_228,&local_240,&local_258,&local_270,&local_288,
                   &local_1f8);
        if (local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_288.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_288.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_288.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_270.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_270.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_270.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_258.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_258.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_258.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_240.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_240.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_240.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_228.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_228.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_210.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_210.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((xt.isEmpty == false) && (yt.isEmpty == false)) {
          interval::interval(&local_108,&xt);
          interval::interval(&local_120,&yt);
          box::box((box *)&xk,(vector<interval,_std::allocator<interval>_> *)&local_108,
                   (vector<interval,_std::allocator<interval>_> *)&local_120);
          box::operator=(&Pt,(box *)&xk);
          box::~box((box *)&xk);
          interval::interval(&local_138,&dhat);
          operator*(&yk,(double)*sdir,&alphahat);
          operator+(&yk,alphashat);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (local_3b8,(long)local_3bc);
          operator+(&xk,piVar10);
          BoxTranslate(&Pxyj,&Pt,&local_138,&local_150,-1);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (local_3a8,(long)local_3bc);
          piVar11 = box::operator[](&Pxyj,1);
          operator&(&xk,piVar10,piVar11);
          piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                              (local_3b0,(long)local_3bc);
          piVar11 = box::operator[](&Pxyj,2);
          operator&(&yk,piVar10,piVar11);
          lVar15 = (long)local_3bc * 8;
          __n = (long)local_3bc;
          while (ppdVar3 = (alpha_mes_vector->super__Deque_base<double,_std::allocator<double>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_node,
                __n < (int)((int)((ulong)((long)(alpha_mes_vector->
                                                super__Deque_base<double,_std::allocator<double>_>).
                                                _M_impl.super__Deque_impl_data._M_start._M_last -
                                         (long)(alpha_mes_vector->
                                               super__Deque_base<double,_std::allocator<double>_>).
                                               _M_impl.super__Deque_impl_data._M_start._M_cur) >> 3)
                            + (int)((ulong)((long)(alpha_mes_vector->
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Deque_impl_data._M_finish._M_cur
                                           - (long)(alpha_mes_vector->
                                                                                                      
                                                  super__Deque_base<double,_std::allocator<double>_>
                                                  )._M_impl.super__Deque_impl_data._M_finish.
                                                  _M_first) >> 3) +
                              ((((uint)((int)ppdVar3 -
                                       *(int *)&(alpha_mes_vector->
                                                super__Deque_base<double,_std::allocator<double>_>).
                                                _M_impl.super__Deque_impl_data._M_start._M_node) >>
                                3) - 1) + (uint)(ppdVar3 == (_Map_pointer)0x0)) * 0x40 + -1)) {
            pdVar4 = (t_history_vector->super__Deque_base<double,_std::allocator<double>_>)._M_impl.
                     super__Deque_impl_data._M_start._M_cur;
            lVar12 = (long)pdVar4 -
                     (long)(t_history_vector->super__Deque_base<double,_std::allocator<double>_>).
                           _M_impl.super__Deque_impl_data._M_start._M_first >> 3;
            uVar7 = __n + lVar12 + 1;
            if (uVar7 < 0x40) {
              pdVar8 = (double *)((long)pdVar4 + lVar15);
            }
            else {
              uVar16 = uVar7 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar7) {
                uVar16 = uVar7 >> 6;
              }
              pdVar8 = (t_history_vector->super__Deque_base<double,_std::allocator<double>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node[uVar16] +
                       lVar12 + uVar16 * -0x40 + __n;
            }
            uVar7 = __n + lVar12;
            if (uVar7 < 0x40) {
              pdVar14 = (double *)((long)pdVar4 + lVar15);
            }
            else {
              uVar16 = uVar7 >> 6 | 0xfc00000000000000;
              if (0 < (long)uVar7) {
                uVar16 = uVar7 >> 6;
              }
              pdVar14 = (t_history_vector->super__Deque_base<double,_std::allocator<double>_>).
                        _M_impl.super__Deque_impl_data._M_start._M_node[uVar16] +
                        lVar12 + uVar16 * -0x40 + __n;
            }
            lVar12 = __n + 1;
            dVar1 = pdVar8[1];
            dVar2 = *pdVar14;
            piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                                (local_3a8,lVar12);
            piVar13 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[](this,__n);
            operator*(&local_1b0,dVar1 - dVar2,piVar13);
            piVar13 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                                (local_3b8,__n);
            Cos(&local_1c8,piVar13);
            operator*(&local_1b0,&local_1c8);
            operator+(&xk,&local_198);
            operator&(&local_2a0,piVar10,&local_180);
            interval::operator=(&xk,&local_2a0);
            piVar10 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                                (local_3b0,lVar12);
            piVar13 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[](this,__n);
            operator*(&local_1b0,dVar1 - dVar2,piVar13);
            piVar13 = std::_Deque_iterator<interval,_interval_&,_interval_*>::operator[]
                                (local_3b8,__n);
            Sin(&local_1c8,piVar13);
            operator*(&local_1b0,&local_1c8);
            operator+(&yk,&local_198);
            operator&(&local_2a0,piVar10,&local_180);
            interval::operator=(&yk,&local_2a0);
            if ((xk.isEmpty != false) || (lVar15 = lVar15 + 8, __n = lVar12, (yk.isEmpty & 1U) != 0)
               ) break;
          }
          interval::interval(&local_60,&xk);
          interval::interval(&local_78,&yk);
          box::box((box *)&local_2a0,(vector<interval,_std::allocator<interval>_> *)&local_60,
                   (vector<interval,_std::allocator<interval>_> *)&local_78);
          box::operator=(&Pxyj,(box *)&local_2a0);
          box::~box((box *)&local_2a0);
          bVar6 = box::IsEmpty(&Pxyj);
          if (!bVar6) {
            std::vector<box,_std::allocator<box>_>::push_back(&Pi,&Pxyj);
            if (Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&Pigroup,
                         (iterator)
                         Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_3bc);
            }
            else {
              *Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish = local_3bc;
              Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish = Pigroup.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        box::~box(&Pt);
        box::~box(&Pxyj);
        local_358 = local_358 + 1;
        pvVar9 = std::
                 _Deque_iterator<std::vector<interval,_std::allocator<interval>_>,_std::vector<interval,_std::allocator<interval>_>_&,_std::vector<interval,_std::allocator<interval>_>_*>
                 ::operator[](this_00,(long)local_3bc);
      } while (local_358 <
               (int)((ulong)((long)(pvVar9->super__Vector_base<interval,_std::allocator<interval>_>)
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pvVar9->super__Vector_base<interval,_std::allocator<interval>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555);
    }
    std::vector<box,_std::allocator<box>_>::~vector(&Pj);
    local_3bc = local_3bc + 1;
  } while( true );
}

Assistant:

inline void Contract_dyn(box& P, deque< vector<interval> >& d_all_mes_vector, deque<double>& alpha_mes_vector, 
						 deque<double>& t_history_vector, deque<interval>& xhat_history_vector, deque<interval>& yhat_history_vector, 
						 deque<interval>& psihat_history_vector, deque<interval>& vrxhat_history_vector, 
						 double& d_max_err, double& alpha_max_err, int& sdir, interval& alphashat, 
						 vector<double>& walls_xa, vector<double>& walls_ya, vector<double>& walls_xb, vector<double>& walls_yb, 
						 vector<double>& circles_x, vector<double>& circles_y, vector<double>& circles_r)
{
	int i = 0, j = 0, k = 0;
	vector<box> Pi;
	vector<int> Pigroup;

	Pi.clear();
	Pigroup.clear();
	for (i = 0; i < (int)alpha_mes_vector.size(); i++)
	{
		vector<box> Pj;
		Pj.clear();
		interval alphahat = interval(alpha_mes_vector[i]-alpha_max_err,alpha_mes_vector[i]+alpha_max_err);
		for (j = 0; j < (int)d_all_mes_vector[i].size(); j++)
		{
			interval dhat = d_all_mes_vector[i][j]+interval(-d_max_err,+d_max_err);
			//
			// Activate only if using getfirst or getlast...
			// If no obstacle found...
			//if ((Center(d_all_mes_vector[i][j]) < 0)||(Center(d_all_mes_vector[i][j]) > rangescale)||(d_all_mes_vector[i][j].isEmpty)) 
			//{
			//	dhat = interval(rangescale-d_max_err,oo);
			//	printf("Bad dhat\n");
			//}
			//

			box Pxyj = box(xhat_history_vector[i],yhat_history_vector[i]);
			box Pt = box(interval(-oo,oo),interval(-oo,oo)); 
			BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], 1);
			interval xt = Pt[1];
			interval yt = Pt[2];
			CPointInSegmentsOrCircles(xt,yt,walls_xa,walls_ya,walls_xb,walls_yb,circles_x,circles_y,circles_r);
			if ((!xt.isEmpty)&&(!yt.isEmpty))
			{
				Pt = box(xt,yt);
				BoxTranslate(Pxyj, Pt, dhat, sdir*alphahat+alphashat+psihat_history_vector[i], -1);

				// Propagate forward to current position...
				interval xk = xhat_history_vector[i] & Pxyj[1];
				interval yk = yhat_history_vector[i] & Pxyj[2];
				for (k = i; k < (int)alpha_mes_vector.size()-1; k++)
				{
					double dt = t_history_vector[k+1]-t_history_vector[k];
					xk = xhat_history_vector[k+1] & (xk+dt*vrxhat_history_vector[k]*Cos(psihat_history_vector[k]));
					yk = yhat_history_vector[k+1] & (yk+dt*vrxhat_history_vector[k]*Sin(psihat_history_vector[k]));
					if ((xk.isEmpty)||(yk.isEmpty)) break;
				}
				Pxyj = box(xk,yk);

				if (!Pxyj.IsEmpty())
				{
					//Pj.push_back(Pxyj);
					Pi.push_back(Pxyj);
					Pigroup.push_back(i);
				}
			}
		}
		//box Pxy = Union(Pj);
		//if (!Pxy.IsEmpty())
		//{
		//	Pi.push_back(Pxy);
		//}
	}
	if (Pi.size() > 0)
	{
		//C_q_in_group(P, alpha_mes_vector.size()-nb_outliers, Pi, Pigroup, alpha_mes_vector.size());
		//C_acc_group(P, Pi, Pigroup, alpha_mes_vector.size());
		//C_q_in(P, Pi.size()-nb_outliers, Pi);
		//C_q_in(P, alpha_mes_vector.size()-nb_outliers, Pi);
		C_acc_opt(P, Pi);
		C_acc_opt(P, Pi);
	}
}